

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32i386.c
# Opt level: O0

Symbol * aros_lnksym(GlobalVars *gv,Section *sec,Reloc *xref)

{
  int iVar1;
  Symbol *pSVar2;
  Symbol *pSVar3;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  GlobalVars *unaff_retaddr;
  uint8_t in_stack_00000010;
  Symbol *sdabase;
  Symbol *sym;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffc4;
  GlobalVars *in_stack_ffffffffffffffc8;
  char *in_stack_fffffffffffffff8;
  
  if (((*(int *)(in_RDI + 0x5c) == 0) && (*(int *)(in_RDI + 0x25c) == 0)) &&
     (iVar1 = strcmp(linkerdb,*(char **)(in_RDX + 0x10)), iVar1 == 0)) {
    uVar4 = 0;
    pSVar2 = addlnksymbol(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,
                          (uint8_t)((ulong)in_RSI >> 0x38),(uint8_t)((ulong)in_RSI >> 0x30),
                          (uint8_t)((ulong)in_RSI >> 0x28),in_stack_00000010,(uint32_t)sdabase);
    pSVar2->extra = 0x80000000;
    pSVar3 = findlnksymbol(in_stack_ffffffffffffffc8,
                           (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar4));
    if (pSVar3 == (Symbol *)0x0) {
      pSVar3 = addlnksymbol(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,
                            (uint8_t)((ulong)in_RSI >> 0x38),(uint8_t)((ulong)in_RSI >> 0x30),
                            (uint8_t)((ulong)in_RSI >> 0x28),in_stack_00000010,(uint32_t)sdabase);
      pSVar3->type = '\x02';
      pSVar3->extra = 0;
    }
  }
  else {
    pSVar2 = elf_lnksym(in_stack_ffffffffffffffc8,
                        (Section *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        (Reloc *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  return pSVar2;
}

Assistant:

static struct Symbol *aros_lnksym(struct GlobalVars *gv,struct Section *sec,
                                  struct Reloc *xref)
{
  struct Symbol *sym;

  if (!gv->dest_object && !gv->use_ldscript) {
    if (!strcmp(linkerdb,xref->xrefname)) {  /* _LinkerDB */
      sym = addlnksymbol(gv,linkerdb,(lword)fff[gv->dest_format]->baseoff,
                         SYM_RELOC,SYMF_LNKSYM,SYMI_OBJECT,SYMB_GLOBAL,0);
      sym->extra = SYMX_SPECIAL|LINKERDB;
      if (findlnksymbol(gv,sdabase_name) == NULL) {
        /* Reference to _LinkerDB creates _SDA_BASE_ */
        struct Symbol *sdabase = addlnksymbol(gv,sdabase_name,
                                              (lword)fff[gv->dest_format]->baseoff,
                                              SYM_ABS,SYMF_LNKSYM,
                                              SYMI_OBJECT,SYMB_GLOBAL,0);
        sdabase->type = SYM_RELOC;
        sdabase->extra = SDABASE;
      }
      return sym;  /* new linker symbol created */
    }
  }

  return elf_lnksym(gv,sec,xref);
}